

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

int Abc_TtFindFirstBit(word *pIn,int nVars)

{
  int iVar1;
  int local_20;
  int nWords;
  int w;
  int nVars_local;
  word *pIn_local;
  
  iVar1 = Abc_TtWordNum(nVars);
  local_20 = 0;
  while( true ) {
    if (iVar1 <= local_20) {
      return -1;
    }
    if (pIn[local_20] != 0) break;
    local_20 = local_20 + 1;
  }
  iVar1 = Abc_Tt6FirstBit(pIn[local_20]);
  return local_20 * 0x40 + iVar1;
}

Assistant:

static inline int Abc_TtFindFirstBit( word * pIn, int nVars )
{
    int w, nWords = Abc_TtWordNum(nVars);
    for ( w = 0; w < nWords; w++ )
        if ( pIn[w] )
            return 64*w + Abc_Tt6FirstBit(pIn[w]);
    return -1;
}